

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

void Bmc_MnaBuild_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Man_t *pNew,Vec_Int_t *vMap,Vec_Int_t *vPiMap
                     )

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar6 = *(ulong *)pObj;
  if ((long)uVar6 < 0) {
    *(ulong *)pObj = uVar6 & 0x7fffffffffffffff;
    if (pObj->Value != 3) {
      __assert_fail("pObj->Value == GIA_UND",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                    ,0xe9,
                    "void Bmc_MnaBuild_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    uVar4 = (uint)uVar6;
    uVar8 = uVar6 & 0x1fffffff;
    if (uVar8 == 0x1fffffff || (int)uVar4 < 0) {
      if ((uVar4 & 0x9fffffff) != 0x9fffffff) {
LAB_0056437a:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                      ,0xfe,
                      "void Bmc_MnaBuild_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      uVar7 = (uint)(uVar6 >> 0x20);
      if (p->vCis->nSize - p->nRegs <= (int)(uVar7 & 0x1fffffff)) {
        pGVar1 = p->pObjs;
        if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_005642fe;
        uVar4 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
        if ((-1 < (int)uVar4) && ((int)uVar4 < vMap->nSize)) {
          if (vMap->pArray[uVar4 & 0x7fffffff] != -1) {
            return;
          }
          __assert_fail("Vec_IntEntry(vMap, Gia_ObjId(p, pObj)) != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                        ,0xf8,
                        "void Bmc_MnaBuild_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
LAB_0056431d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->vCis->nSize - p->nRegs <= (int)(uVar7 & 0x1fffffff)) goto LAB_0056437a;
      if (-1 < (int)uVar4) {
        __assert_fail("pObj->fTerm",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
      }
      Vec_IntPush(vPiMap,uVar7 & 0x1fffffff);
      pGVar1 = p->pObjs;
      if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_005642fe;
      pGVar5 = Gia_ManAppendObj(pNew);
      uVar6 = *(ulong *)pGVar5;
      *(ulong *)pGVar5 = uVar6 | 0x9fffffff;
      *(ulong *)pGVar5 =
           uVar6 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = pNew->pObjs;
      if ((pGVar5 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar5)) goto LAB_005642fe;
      Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = pNew->pObjs;
      if ((pGVar5 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar5)) goto LAB_005642fe;
      uVar9 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
      if (((int)uVar9 < 0) || (vMap->nSize <= (int)uVar9)) goto LAB_0056433c;
      iVar3 = (int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2) * 0x55555556;
    }
    else {
      if (pObj[-uVar8].Value == 3) {
        Bmc_MnaBuild_rec(p,pObj + -uVar8,pNew,vMap,vPiMap);
      }
      uVar6 = (ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      if (pObj[-uVar6].Value == 3) {
        Bmc_MnaBuild_rec(p,pObj + -uVar6,pNew,vMap,vPiMap);
      }
      uVar6 = *(ulong *)pObj;
      uVar4 = 1;
      uVar7 = 1;
      if (pObj[-(ulong)((uint)uVar6 & 0x1fffffff)].Value == 3) {
        pGVar1 = p->pObjs;
        if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_005642fe;
        uVar7 = (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555 -
                ((uint)uVar6 & 0x1fffffff);
        if (((int)uVar7 < 0) || (vMap->nSize <= (int)uVar7)) goto LAB_0056431d;
        if (vMap->pArray[uVar7] < 0) goto LAB_00564399;
        uVar7 = vMap->pArray[uVar7] ^ (uint)(uVar6 >> 0x1d) & 1;
      }
      uVar9 = (uint)(uVar6 >> 0x20);
      if (pObj[-(ulong)(uVar9 & 0x1fffffff)].Value == 3) {
        pGVar1 = p->pObjs;
        if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_005642fe;
        uVar4 = (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555 - (uVar9 & 0x1fffffff);
        if (((int)uVar4 < 0) || (vMap->nSize <= (int)uVar4)) goto LAB_0056431d;
        if (vMap->pArray[uVar4] < 0) {
LAB_00564399:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar4 = vMap->pArray[uVar4] ^ uVar9 >> 0x1d & 1;
      }
      pGVar1 = p->pObjs;
      if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
LAB_005642fe:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar9 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
      iVar3 = Gia_ManHashAnd(pNew,uVar7,uVar4);
      if (((int)uVar9 < 0) || (vMap->nSize <= (int)uVar9)) {
LAB_0056433c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
    }
    vMap->pArray[uVar9 & 0x7fffffff] = iVar3;
  }
  return;
}

Assistant:

void Bmc_MnaBuild_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Man_t * pNew, Vec_Int_t * vMap, Vec_Int_t * vPiMap )
{
    if ( !pObj->fPhase )
        return;
    pObj->fPhase = 0;
    assert( pObj->Value == GIA_UND );
    if ( Gia_ObjIsAnd(pObj) )
    {
        int iLit0 = 1, iLit1 = 1;
        if ( Gia_ObjFanin0(pObj)->Value == GIA_UND )
            Bmc_MnaBuild_rec( p, Gia_ObjFanin0(pObj), pNew, vMap, vPiMap );
        if ( Gia_ObjFanin1(pObj)->Value == GIA_UND )
            Bmc_MnaBuild_rec( p, Gia_ObjFanin1(pObj), pNew, vMap, vPiMap );
        if ( Gia_ObjFanin0(pObj)->Value == GIA_UND )
            iLit0 = Abc_LitNotCond( Vec_IntEntry(vMap, Gia_ObjFaninId0p(p, pObj)), Gia_ObjFaninC0(pObj) );
        if ( Gia_ObjFanin1(pObj)->Value == GIA_UND )
            iLit1 = Abc_LitNotCond( Vec_IntEntry(vMap, Gia_ObjFaninId1p(p, pObj)), Gia_ObjFaninC1(pObj) );
        Vec_IntWriteEntry( vMap, Gia_ObjId(p, pObj), Gia_ManHashAnd(pNew, iLit0, iLit1) );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        assert( Vec_IntEntry(vMap, Gia_ObjId(p, pObj)) != -1 );
    else if ( Gia_ObjIsPi(p, pObj) )
    {
        Vec_IntPush( vPiMap, Gia_ObjCioId(pObj) );
        Vec_IntWriteEntry( vMap, Gia_ObjId(p, pObj), Gia_ManAppendCi(pNew) );
    }
    else assert( 0 );
}